

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O1

Maybe<capnp::compiler::Compiler::Node::Content_&> __thiscall
capnp::compiler::Compiler::Node::getContent(Node *this,State minimumState)

{
  Content *pCVar1;
  RemoveConst<capnp::compiler::Compiler::Node_*> **pppNVar2;
  State SVar3;
  Module *pMVar4;
  Impl *pIVar5;
  Node **ppNVar6;
  CompiledModule *pCVar7;
  Reader *pRVar8;
  ArrayDisposer *pAVar9;
  Reader *pRVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ushort uVar14;
  int iVar15;
  Node *pNVar16;
  ulong uVar17;
  ulong uVar18;
  NodeTranslator *pNVar19;
  long *ptr;
  ulong uVar20;
  Exception *params_1;
  SegmentReader *pSVar21;
  size_t sVar22;
  ElementCount EVar23;
  Node **ppNVar24;
  Alias *ptrCopy;
  Node *ptrCopy_1;
  Arena *pAVar25;
  ArrayPtr<const_char> AVar26;
  Reader value;
  Fault f;
  SegmentReader *pSStack_3b0;
  CapTableReader *local_3a8;
  Node *pNStack_3a0;
  StructDataBitCount local_398;
  StructPointerCount SStack_394;
  undefined2 uStack_392;
  ListElementCount LStack_390;
  undefined4 uStack_38c;
  Builder nestedNodes;
  PointerReader local_340;
  _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
  *local_320;
  Vector<capnp::compiler::Compiler::Node_*> *local_318;
  Orphan<capnp::schema::Node> schemaNode;
  Reader nestedDecl;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined1 local_298 [264];
  NullableValue<kj::Exception> exception;
  
  if (this->isBuiltin == true) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
              ((Fault *)&exception,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
               ,0x1ce,FAILED,"!isBuiltin","\"illegal method call for built-in declaration\"",
               (char (*) [45])"illegal method call for built-in declaration");
    kj::_::Debug::Fault::fatal((Fault *)&exception);
  }
  pCVar1 = &this->guardedContent;
  SVar3 = (this->guardedContent).state;
  if ((int)minimumState <= (int)SVar3) {
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)pCVar1;
  }
  if (this->inGetContent == true) {
    pMVar4 = this->module->parserModule;
    (**(pMVar4->super_ErrorReporter)._vptr_ErrorReporter)
              (pMVar4,(ulong)this->startByte,(ulong)this->endByte,
               "Declaration recursively depends on itself.",0x2b);
    return (Maybe<capnp::compiler::Compiler::Node::Content_&>)(Content *)0x0;
  }
  this->inGetContent = true;
  if (SVar3 != BOOTSTRAP) {
    if (SVar3 != EXPANDED) {
      if ((SVar3 != STUB) || ((int)minimumState < 1)) goto LAB_0045e032;
      if ((this->declaration)._reader.pointerCount < 3) {
        nestedDecl._reader.pointers._0_4_ = 0x7fffffff;
        nestedDecl._reader.capTable = (CapTableReader *)0x0;
        nestedDecl._reader.data = (WirePointer *)0x0;
        nestedDecl._reader.segment = (SegmentReader *)0x0;
      }
      else {
        nestedDecl._reader.segment = (this->declaration)._reader.segment;
        nestedDecl._reader.capTable = (this->declaration)._reader.capTable;
        nestedDecl._reader.data = (this->declaration)._reader.pointers + 2;
        nestedDecl._reader.pointers._0_4_ = (this->declaration)._reader.nestingLimit;
      }
      pIVar5 = this->module->compiler;
      capnp::_::PointerReader::getList
                ((ListReader *)&exception,(PointerReader *)&nestedDecl,INLINE_COMPOSITE,(word *)0x0)
      ;
      uVar11 = exception.field_1._16_4_;
      if (exception.field_1._16_4_ != 0) {
        pAVar25 = &pIVar5->nodeArena;
        local_320 = (_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
                     *)&(this->guardedContent).aliases;
        local_318 = &(this->guardedContent).orderedNestedNodes;
        EVar23 = 0;
        do {
          capnp::_::ListReader::getStructElement
                    (&nestedDecl._reader,(ListReader *)&exception,EVar23);
          if (nestedDecl._reader.dataSize < 0x20) {
            uVar14 = 0;
          }
          else {
            uVar14 = *(ushort *)((long)nestedDecl._reader.data + 2);
          }
          if (0xd < uVar14) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,char_const(&)[25],capnp::compiler::Declaration::Reader&>
                      (&f,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
                       ,0x205,FAILED,(char *)0x0,"\"unknown declaration type\", nestedDecl",
                       (char (*) [25])"unknown declaration type",&nestedDecl);
            kj::_::Debug::Fault::fatal(&f);
          }
          if ((0x35d0U >> (uVar14 & 0x1f) & 1) == 0) {
            if ((0xa2dU >> (uVar14 & 0x1f) & 1) == 0) {
              if (nestedDecl._reader.pointerCount < 6) {
                nestedNodes.builder.elementCount = 0x7fffffff;
                nestedNodes.builder.capTable = (CapTableBuilder *)0x0;
                nestedNodes.builder.ptr = (byte *)0x0;
                nestedNodes.builder.segment = (SegmentBuilder *)0x0;
              }
              else {
                nestedNodes.builder.ptr =
                     (byte *)(CONCAT44(nestedDecl._reader.pointers._4_4_,
                                       (int)nestedDecl._reader.pointers) + 0x28);
                nestedNodes.builder.capTable = (CapTableBuilder *)nestedDecl._reader.capTable;
                nestedNodes.builder.segment = (SegmentBuilder *)nestedDecl._reader.segment;
                nestedNodes.builder.elementCount = nestedDecl._reader.nestingLimit;
              }
              pCVar7 = this->module;
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&f,(PointerReader *)&nestedNodes,(word *)0x0);
              pNVar16 = (Node *)kj::Arena::allocateBytes(pAVar25,0xd8,8,false);
              (pNVar16->super_Resolver)._vptr_Resolver = (_func_int **)pCVar7;
              pNVar16->module = (CompiledModule *)this;
              (pNVar16->parent).ptr = (Node *)f.exception;
              (pNVar16->declaration)._reader.segment = pSStack_3b0;
              (pNVar16->declaration)._reader.capTable = local_3a8;
              (pNVar16->declaration)._reader.data = pNStack_3a0;
              (pNVar16->declaration)._reader.pointers =
                   (WirePointer *)CONCAT26(uStack_392,CONCAT24(SStack_394,local_398));
              (pNVar16->declaration)._reader.dataSize = LStack_390;
              (pNVar16->declaration)._reader.pointerCount = (short)uStack_38c;
              *(short *)&(pNVar16->declaration)._reader.field_0x26 = SUB42(uStack_38c,2);
              *(undefined1 *)&(pNVar16->declaration)._reader.nestingLimit = 0;
              (pNVar16->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
              (pNVar16->guardedContent).orderedNestedNodes.builder.pos =
                   (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
              (pNVar16->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
              (pNVar16->guardedContent).orderedNestedNodes.builder.disposer = (ArrayDisposer *)0x0;
              *(undefined1 *)&(pNVar16->guardedContent).aliases._M_t._M_impl = 0;
              if (nestedDecl._reader.pointerCount == 0) {
                nestedNodes.builder.elementCount = 0x7fffffff;
                nestedNodes.builder.capTable = (CapTableBuilder *)0x0;
                nestedNodes.builder.ptr = (byte *)0x0;
                nestedNodes.builder.segment = (SegmentBuilder *)0x0;
              }
              else {
                nestedNodes.builder.ptr =
                     (byte *)CONCAT44(nestedDecl._reader.pointers._4_4_,
                                      (int)nestedDecl._reader.pointers);
                nestedNodes.builder.capTable = (CapTableBuilder *)nestedDecl._reader.capTable;
                nestedNodes.builder.segment = (SegmentBuilder *)nestedDecl._reader.segment;
                nestedNodes.builder.elementCount = nestedDecl._reader.nestingLimit;
              }
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&f,(PointerReader *)&nestedNodes,(word *)0x0);
              if (SStack_394 == 0) {
                nestedNodes.builder.elementCount = 0x7fffffff;
                nestedNodes.builder.capTable = (CapTableBuilder *)0x0;
                pNStack_3a0 = (Node *)0x0;
                nestedNodes.builder.segment = (SegmentBuilder *)0x0;
              }
              else {
                nestedNodes.builder.capTable = (CapTableBuilder *)pSStack_3b0;
                nestedNodes.builder.segment = (SegmentBuilder *)f.exception;
                nestedNodes.builder.elementCount = LStack_390;
              }
              nestedNodes.builder.ptr = (byte *)pNStack_3a0;
              _f = (ArrayPtr<const_char>)
                   capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&nestedNodes,(void *)0x0,0);
              local_3a8 = (CapTableReader *)
                          &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::instance;
              std::
              _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Alias>>>>
              ::_M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Alias>>>
                        (local_320,
                         (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias>_> *)&f);
              pNStack_3a0 = pNVar16;
              if (pNVar16 != (Node *)0x0) {
                pNStack_3a0 = (Node *)0x0;
                kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::disposeImpl
                          ((DestructorOnlyDisposer<capnp::compiler::Compiler::Alias> *)
                           &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Alias>::instance,
                           pNVar16);
              }
            }
            else {
              pNVar16 = (Node *)kj::Arena::allocateBytes(pAVar25,0x1c0,8,false);
              Node(pNVar16,this,&nestedDecl);
              if (nestedDecl._reader.pointerCount == 0) {
                nestedNodes.builder.elementCount = 0x7fffffff;
                nestedNodes.builder.capTable = (CapTableBuilder *)0x0;
                nestedNodes.builder.ptr = (byte *)0x0;
                nestedNodes.builder.segment = (SegmentBuilder *)0x0;
              }
              else {
                nestedNodes.builder.ptr =
                     (byte *)CONCAT44(nestedDecl._reader.pointers._4_4_,
                                      (int)nestedDecl._reader.pointers);
                nestedNodes.builder.capTable = (CapTableBuilder *)nestedDecl._reader.capTable;
                nestedNodes.builder.segment = (SegmentBuilder *)nestedDecl._reader.segment;
                nestedNodes.builder.elementCount = nestedDecl._reader.nestingLimit;
              }
              capnp::_::PointerReader::getStruct
                        ((StructReader *)&f,(PointerReader *)&nestedNodes,(word *)0x0);
              if (SStack_394 == 0) {
                nestedNodes.builder.elementCount = 0x7fffffff;
                nestedNodes.builder.capTable = (CapTableBuilder *)0x0;
                pNStack_3a0 = (Node *)0x0;
                nestedNodes.builder.segment = (SegmentBuilder *)0x0;
              }
              else {
                nestedNodes.builder.capTable = (CapTableBuilder *)pSStack_3b0;
                nestedNodes.builder.segment = (SegmentBuilder *)f.exception;
                nestedNodes.builder.elementCount = LStack_390;
              }
              nestedNodes.builder.ptr = (byte *)pNStack_3a0;
              AVar26 = (ArrayPtr<const_char>)
                       capnp::_::PointerReader::getBlob<capnp::Text>
                                 ((PointerReader *)&nestedNodes,(void *)0x0,0);
              ppNVar24 = (this->guardedContent).orderedNestedNodes.builder.endPtr;
              if ((this->guardedContent).orderedNestedNodes.builder.pos == ppNVar24) {
                ppNVar6 = (local_318->builder).ptr;
                sVar22 = (long)ppNVar24 - (long)ppNVar6 >> 2;
                if (ppNVar24 == ppNVar6) {
                  sVar22 = 4;
                }
                kj::Vector<capnp::compiler::Compiler::Node_*>::setCapacity(local_318,sVar22);
              }
              *(this->guardedContent).orderedNestedNodes.builder.pos = pNVar16;
              pppNVar2 = &(this->guardedContent).orderedNestedNodes.builder.pos;
              *pppNVar2 = *pppNVar2 + 1;
              local_3a8 = (CapTableReader *)
                          &kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance;
              _f = AVar26;
              std::
              _Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
              ::_M_emplace_equal<std::pair<kj::StringPtr,kj::Own<capnp::compiler::Compiler::Node>>>
                        ((_Rb_tree<kj::StringPtr,std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>,std::_Select1st<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::Own<capnp::compiler::Compiler::Node>>>>
                          *)&(this->guardedContent).nestedNodes,
                         (pair<kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node>_> *)&f);
              pNStack_3a0 = pNVar16;
              if (pNVar16 != (Node *)0x0) {
                pNStack_3a0 = (Node *)0x0;
                (*(code *)*kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance)
                          (&kj::DestructorOnlyDisposer<capnp::compiler::Compiler::Node>::instance,
                           (_func_int *)
                           ((long)&(pNVar16->super_Resolver)._vptr_Resolver +
                           (long)(pNVar16->super_Resolver)._vptr_Resolver[-2]));
              }
            }
          }
          EVar23 = EVar23 + 1;
        } while (uVar11 != EVar23);
      }
      pCVar1->state = EXPANDED;
    }
    if ((int)minimumState < 2) goto LAB_0045e032;
    pIVar5 = this->module->compiler;
    capnp::_::OrphanBuilder::initStruct
              ((OrphanBuilder *)&exception,(pIVar5->workspace).orphanage.arena,
               (pIVar5->workspace).orphanage.capTable,(StructSize)0x60005);
    schemaNode.builder.capTable = (CapTableBuilder *)exception.field_1.value.ownFile.content.size_;
    schemaNode.builder.location = (word *)exception.field_1.value.ownFile.content.disposer;
    schemaNode.builder.tag.content = exception._0_8_;
    schemaNode.builder.segment = (SegmentBuilder *)exception.field_1.value.ownFile.content.ptr;
    capnp::_::OrphanBuilder::asStruct((StructBuilder *)&f,&schemaNode.builder,(StructSize)0x60005);
    local_3a8->_vptr_CapTableReader = (_func_int **)this->id;
    exception._0_8_ = f.exception;
    exception.field_1.value.ownFile.content.ptr = (char *)pSStack_3b0;
    exception.field_1.value.ownFile.content.size_ = (size_t)pNStack_3a0;
    capnp::_::PointerBuilder::setBlob<capnp::Text>
              ((PointerBuilder *)&exception,(Reader)(this->displayName).content);
    uVar17 = (this->displayName).content.size_ - 1;
    uVar18 = uVar17;
    do {
      uVar20 = uVar18;
      if (uVar20 == 0) break;
      uVar18 = uVar20 - 1;
    } while ((this->displayName).content.ptr[uVar20 - 1] != '.');
    if (uVar20 != 0) {
      *(int *)&local_3a8[1]._vptr_CapTableReader = (int)(uVar20 - 1) + 1;
    }
    do {
      uVar18 = uVar17;
      uVar17 = uVar18 - 1;
      if (uVar18 == 0) break;
    } while ((this->displayName).content.ptr[uVar18 - 1] != ':');
    if ((uVar18 != 0) && (*(uint *)&local_3a8[1]._vptr_CapTableReader < uVar17)) {
      *(int *)&local_3a8[1]._vptr_CapTableReader = (int)uVar17 + 1;
    }
    pNVar16 = (this->parent).ptr;
    if (pNVar16 != (Node *)0x0) {
      local_3a8[2]._vptr_CapTableReader = (_func_int **)pNVar16->id;
    }
    exception.field_1.value.ownFile.content.size_ = (size_t)&pNStack_3a0->module;
    exception._0_8_ = f.exception;
    exception.field_1.value.ownFile.content.ptr = (char *)pSStack_3b0;
    capnp::_::PointerBuilder::initStructList
              (&nestedNodes.builder,(PointerBuilder *)&exception,
               (ElementCount)
               ((ulong)((long)(this->guardedContent).orderedNestedNodes.builder.pos -
                       (long)(this->guardedContent).orderedNestedNodes.builder.ptr) >> 3),
               (StructSize)0x10001);
    ppNVar24 = (this->guardedContent).orderedNestedNodes.builder.ptr;
    ppNVar6 = (this->guardedContent).orderedNestedNodes.builder.pos;
    if (ppNVar24 != ppNVar6) {
      EVar23 = 0;
      do {
        pNVar16 = *ppNVar24;
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&nestedDecl,&nestedNodes.builder,EVar23);
        if ((pNVar16->declaration)._reader.pointerCount == 0) {
          local_340.nestingLimit = 0x7fffffff;
          local_340.capTable = (CapTableReader *)0x0;
          local_340.pointer = (WirePointer *)0x0;
          local_340.segment = (SegmentReader *)0x0;
        }
        else {
          local_340.segment = (pNVar16->declaration)._reader.segment;
          local_340.capTable = (pNVar16->declaration)._reader.capTable;
          local_340.pointer = (pNVar16->declaration)._reader.pointers;
          local_340.nestingLimit = (pNVar16->declaration)._reader.nestingLimit;
        }
        capnp::_::PointerReader::getStruct((StructReader *)&exception,&local_340,(word *)0x0);
        if (exception.field_1._28_2_ == 0) {
          local_340.nestingLimit = 0x7fffffff;
          local_340.capTable = (CapTableReader *)0x0;
          local_340.pointer = (WirePointer *)0x0;
          local_340.segment = (SegmentReader *)0x0;
        }
        else {
          local_340.capTable = (CapTableReader *)exception.field_1.value.ownFile.content.ptr;
          local_340.pointer = (WirePointer *)exception.field_1.value.ownFile.content.disposer;
          local_340.segment = (SegmentReader *)exception._0_8_;
          local_340.nestingLimit = exception.field_1.value.line;
        }
        value = capnp::_::PointerReader::getBlob<capnp::Text>(&local_340,(void *)0x0,0);
        local_340.pointer =
             (WirePointer *)
             CONCAT44(nestedDecl._reader.pointers._4_4_,(int)nestedDecl._reader.pointers);
        local_340.segment = nestedDecl._reader.segment;
        local_340.capTable = nestedDecl._reader.capTable;
        capnp::_::PointerBuilder::setBlob<capnp::Text>((PointerBuilder *)&local_340,value);
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&exception,&nestedNodes.builder,EVar23);
        *(uint64_t *)exception.field_1.value.ownFile.content.size_ = pNVar16->id;
        EVar23 = EVar23 + 1;
        ppNVar24 = ppNVar24 + 1;
      } while (ppNVar24 != ppNVar6);
    }
    pAVar25 = &(pIVar5->workspace).arena;
    params_1 = (Exception *)&this->declaration;
    exception.isSet = this->module->compiler->annotationFlag == COMPILE_ANNOTATIONS;
    pNVar19 = kj::Arena::
              allocate<capnp::compiler::NodeTranslator,capnp::compiler::Compiler::Node&,capnp::compiler::ErrorReporter&,capnp::compiler::Declaration::Reader&,capnp::Orphan<capnp::schema::Node>,bool>
                        (pAVar25,this,&this->module->parserModule->super_ErrorReporter,
                         (Reader *)params_1,&schemaNode,&exception.isSet);
    (this->guardedContent).translator = pNVar19;
    local_340.segment = (SegmentReader *)&PTR_run_0064b650;
    local_340.capTable = (CapTableReader *)pCVar1;
    local_340.pointer = (WirePointer *)&pIVar5->workspace;
    kj::_::runCatchingExceptions((Maybe<kj::Exception> *)&nestedDecl,(Runnable *)&local_340);
    exception.isSet = nestedDecl._reader.segment._0_1_;
    if (nestedDecl._reader.segment._0_1_ == true) {
      exception.field_1.value.ownFile.content.ptr = (char *)nestedDecl._reader.capTable;
      exception.field_1.value.ownFile.content.disposer =
           (ArrayDisposer *)
           CONCAT44(nestedDecl._reader.pointers._4_4_,(int)nestedDecl._reader.pointers);
      exception.field_1.value.ownFile.content.size_ = (size_t)nestedDecl._reader.data;
      nestedDecl._reader.capTable = (CapTableReader *)0x0;
      nestedDecl._reader.data = (void *)0x0;
      exception.field_1.value.file =
           (char *)CONCAT26(nestedDecl._reader._38_2_,
                            CONCAT24(nestedDecl._reader.pointerCount,nestedDecl._reader.dataSize));
      exception.field_1._32_8_ = CONCAT44(nestedDecl._reader._44_4_,nestedDecl._reader.nestingLimit)
      ;
      exception.field_1.value.description.content.ptr = (char *)local_2c0;
      exception.field_1.value.description.content.size_ = uStack_2b8;
      exception.field_1.value.description.content.disposer = (ArrayDisposer *)local_2b0;
      exception.field_1.value.context.ptr.disposer = (Disposer *)uStack_2a8;
      exception.field_1.value.context.ptr.ptr = (Context *)local_2a0;
      memcpy((void *)((long)&exception.field_1 + 0x50),local_298,0x104);
      kj::Exception::~Exception((Exception *)&nestedDecl._reader.capTable);
    }
    if (exception.isSet == true) {
      if ((this->guardedContent).bootstrapSchema.ptr.isSet == true) {
        (this->guardedContent).bootstrapSchema.ptr.isSet = false;
      }
      iVar15 = (*(this->module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[1])();
      if ((char)iVar15 == '\0') {
        kj::str<char_const(&)[60],kj::Exception&>
                  ((String *)&nestedDecl,
                   (kj *)"Internal compiler bug: Bootstrap schema failed validation:\n",
                   (char (*) [60])&exception.field_1,params_1);
        pSVar21 = nestedDecl._reader.segment;
        if (nestedDecl._reader.capTable == (CapTableReader *)0x0) {
          pSVar21 = (SegmentReader *)0x515344;
        }
        pMVar4 = this->module->parserModule;
        (**(pMVar4->super_ErrorReporter)._vptr_ErrorReporter)
                  (pMVar4,(ulong)this->startByte,(ulong)this->endByte,pSVar21,
                   (long)&(nestedDecl._reader.capTable)->_vptr_CapTableReader +
                   (ulong)(nestedDecl._reader.capTable == (CapTableReader *)0x0));
        kj::String::~String((String *)&nestedDecl);
      }
    }
    if (exception.isSet == true) {
      kj::Exception::~Exception(&exception.field_1.value);
    }
    ptr = (long *)kj::Arena::allocateBytes(pAVar25,0x10,8,true);
    *ptr = (long)pCVar1;
    *(undefined1 *)(ptr + 1) = 0;
    kj::Arena::setDestructor
              (pAVar25,ptr,
               kj::Arena::
               destroyObject<kj::_::Deferred<capnp::compiler::Compiler::Node::getContent(capnp::compiler::Compiler::Node::Content::State)::__2>>
              );
    pCVar1->state = BOOTSTRAP;
    if (schemaNode.builder.segment != (SegmentBuilder *)0x0) {
      capnp::_::OrphanBuilder::euthanize(&schemaNode.builder);
    }
  }
  if (2 < (int)minimumState) {
    NodeTranslator::finish((NodeSet *)&exception,(this->guardedContent).translator);
    if ((this->guardedContent).finalSchema.ptr.isSet == true) {
      (this->guardedContent).finalSchema.ptr.isSet = false;
    }
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x20) =
         exception.field_1._24_4_;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x24) =
         exception.field_1._28_4_;
    *(int *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x28) =
         exception.field_1.value.line;
    *(Type *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x2c) =
         exception.field_1.value.type;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x10) =
         exception.field_1.value.ownFile.content.size_._0_4_;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x14) =
         exception.field_1.value.ownFile.content.size_._4_4_;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x18) =
         exception.field_1._16_4_;
    *(undefined4 *)((long)&(this->guardedContent).finalSchema.ptr.field_1 + 0x1c) =
         exception.field_1._20_4_;
    (this->guardedContent).finalSchema.ptr.field_1.value._reader.segment =
         (SegmentReader *)exception._0_8_;
    (this->guardedContent).finalSchema.ptr.field_1.value._reader.capTable =
         (CapTableReader *)exception.field_1.value.ownFile.content.ptr;
    (this->guardedContent).finalSchema.ptr.isSet = true;
    pRVar8 = (this->guardedContent).auxSchemas.ptr;
    if (pRVar8 != (Reader *)0x0) {
      sVar22 = (this->guardedContent).auxSchemas.size_;
      (this->guardedContent).auxSchemas.ptr = (Reader *)0x0;
      (this->guardedContent).auxSchemas.size_ = 0;
      pAVar9 = (this->guardedContent).auxSchemas.disposer;
      (**pAVar9->_vptr_ArrayDisposer)(pAVar9,pRVar8,0x30,sVar22,sVar22,0);
    }
    (this->guardedContent).auxSchemas.ptr =
         (Reader *)exception.field_1.value.description.content.ptr;
    (this->guardedContent).auxSchemas.size_ = exception.field_1.value.description.content.size_;
    (this->guardedContent).auxSchemas.disposer =
         exception.field_1.value.description.content.disposer;
    exception.field_1.value.description.content.ptr = (char *)0x0;
    exception.field_1.value.description.content.size_ = 0;
    pRVar10 = (this->guardedContent).sourceInfo.ptr;
    if (pRVar10 != (Reader *)0x0) {
      sVar22 = (this->guardedContent).sourceInfo.size_;
      (this->guardedContent).sourceInfo.ptr = (Reader *)0x0;
      (this->guardedContent).sourceInfo.size_ = 0;
      pAVar9 = (this->guardedContent).sourceInfo.disposer;
      (**pAVar9->_vptr_ArrayDisposer)(pAVar9,pRVar10,0x30,sVar22,sVar22,0);
    }
    uVar13 = exception.field_1.value.description.content.size_;
    uVar12 = exception.field_1.value.description.content.ptr;
    (this->guardedContent).sourceInfo.ptr = (Reader *)exception.field_1.value.context.ptr.disposer;
    (this->guardedContent).sourceInfo.size_ = (size_t)exception.field_1.value.context.ptr.ptr;
    (this->guardedContent).sourceInfo.disposer = (ArrayDisposer *)exception.field_1.value.trace[0];
    exception.field_1.value.context.ptr.disposer = (Disposer *)0x0;
    exception.field_1.value.context.ptr.ptr = (Context *)0x0;
    (this->guardedContent).state = FINISHED;
    if (exception.field_1.value.description.content.ptr != (char *)0x0) {
      exception.field_1.value.description.content.ptr = (char *)0x0;
      exception.field_1.value.description.content.size_ = 0;
      (**(exception.field_1.value.description.content.disposer)->_vptr_ArrayDisposer)
                (exception.field_1.value.description.content.disposer,uVar12,0x30,uVar13,uVar13,0);
    }
  }
LAB_0045e032:
  this->inGetContent = false;
  return (Maybe<capnp::compiler::Compiler::Node::Content_&>)pCVar1;
}

Assistant:

kj::Maybe<Compiler::Node::Content&> Compiler::Node::getContent(Content::State minimumState) {
  KJ_REQUIRE(!isBuiltin, "illegal method call for built-in declaration");

  auto& content = guardedContent;

  if (content.stateHasReached(minimumState)) {
    return content;
  }

  if (inGetContent) {
    addError("Declaration recursively depends on itself.");
    return nullptr;
  }

  inGetContent = true;
  KJ_DEFER(inGetContent = false);

  switch (content.state) {
    case Content::STUB: {
      if (minimumState <= Content::STUB) break;

      // Expand the child nodes.
      auto& arena = module->getCompiler().getNodeArena();

      for (auto nestedDecl: declaration.getNestedDecls()) {
        switch (nestedDecl.which()) {
          case Declaration::FILE:
          case Declaration::CONST:
          case Declaration::ANNOTATION:
          case Declaration::ENUM:
          case Declaration::STRUCT:
          case Declaration::INTERFACE: {
            kj::Own<Node> subNode = arena.allocateOwn<Node>(*this, nestedDecl);
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.orderedNestedNodes.add(subNode);
            content.nestedNodes.insert(std::make_pair(name, kj::mv(subNode)));
            break;
          }

          case Declaration::USING: {
            kj::Own<Alias> alias = arena.allocateOwn<Alias>(
                *module, *this, nestedDecl.getUsing().getTarget());
            kj::StringPtr name = nestedDecl.getName().getValue();
            content.aliases.insert(std::make_pair(name, kj::mv(alias)));
            break;
          }
          case Declaration::ENUMERANT:
          case Declaration::FIELD:
          case Declaration::UNION:
          case Declaration::GROUP:
          case Declaration::METHOD:
          case Declaration::NAKED_ID:
          case Declaration::NAKED_ANNOTATION:
            // Not a node.  Skip.
            break;
          default:
            KJ_FAIL_ASSERT("unknown declaration type", nestedDecl);
            break;
        }
      }

      content.advanceState(Content::EXPANDED);
    } // fallthrough

    case Content::EXPANDED: {
      if (minimumState <= Content::EXPANDED) break;

      // Construct the NodeTranslator.
      auto& workspace = module->getCompiler().getWorkspace();

      auto schemaNode = workspace.orphanage.newOrphan<schema::Node>();
      auto builder = schemaNode.get();
      builder.setId(id);
      builder.setDisplayName(displayName);
      // TODO(cleanup):  Would be better if we could remember the prefix length from before we
      //   added this decl's name to the end.
      KJ_IF_MAYBE(lastDot, displayName.findLast('.')) {
        builder.setDisplayNamePrefixLength(*lastDot + 1);
      }
      KJ_IF_MAYBE(lastColon, displayName.findLast(':')) {
        if (*lastColon > builder.getDisplayNamePrefixLength()) {
          builder.setDisplayNamePrefixLength(*lastColon + 1);
        }
      }
      KJ_IF_MAYBE(p, parent) {
        builder.setScopeId(p->id);
      }

      auto nestedNodes = builder.initNestedNodes(content.orderedNestedNodes.size());
      auto nestedIter = nestedNodes.begin();
      for (auto node: content.orderedNestedNodes) {
        nestedIter->setName(node->declaration.getName().getValue());
        nestedIter->setId(node->id);
        ++nestedIter;
      }

      content.translator = &workspace.arena.allocate<NodeTranslator>(
          *this, module->getErrorReporter(), declaration, kj::mv(schemaNode),
          module->getCompiler().shouldCompileAnnotations());
      KJ_IF_MAYBE(exception, kj::runCatchingExceptions([&](){
        auto nodeSet = content.translator->getBootstrapNode();
        for (auto& auxNode: nodeSet.auxNodes) {
          workspace.bootstrapLoader.loadOnce(auxNode);
        }
        content.bootstrapSchema = workspace.bootstrapLoader.loadOnce(nodeSet.node);
      })) {
        content.bootstrapSchema = nullptr;
        // Only bother to report validation failures if we think we haven't seen any errors.
        // Otherwise we assume that the errors caused the validation failure.
        if (!module->getErrorReporter().hadErrors()) {
          addError(kj::str("Internal compiler bug: Bootstrap schema failed validation:\n",
                           *exception));
        }
      }

      // If the Workspace is destroyed, revert the node to the EXPANDED state, because the
      // NodeTranslator is no longer valid in this case.
      workspace.arena.copy(kj::defer([&content]() {
        content.bootstrapSchema = nullptr;
        if (content.state > Content::EXPANDED) {
          content.state = Content::EXPANDED;
        }
      }));

      content.advanceState(Content::BOOTSTRAP);
    } // fallthrough

    case Content::BOOTSTRAP: {
      if (minimumState <= Content::BOOTSTRAP) break;

      // Create the final schema.
      auto nodeSet = content.translator->finish();
      content.finalSchema = nodeSet.node;
      content.auxSchemas = kj::mv(nodeSet.auxNodes);
      content.sourceInfo = kj::mv(nodeSet.sourceInfo);

      content.advanceState(Content::FINISHED);
    } // fallthrough

    case Content::FINISHED:
      break;
  }

  return content;
}